

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O0

void pacf_yw(double *vec,int N,double *par,int M)

{
  double *phi;
  double *temp;
  int i;
  int M_local;
  double *par_local;
  int N_local;
  double *vec_local;
  
  phi = (double *)malloc((long)M << 3);
  for (temp._0_4_ = 0; (int)temp < M; temp._0_4_ = (int)temp + 1) {
    ywalg(vec,N,(int)temp + 1,phi);
    par[(int)temp] = phi[(int)temp];
  }
  free(phi);
  return;
}

Assistant:

void pacf_yw(double* vec, int N, double* par, int M) {
	int i;
	double *temp;

	temp = (double*)malloc(sizeof(double)* M);
	for (i = 0; i < M; ++i) {
		ywalg(vec, N, i + 1, temp);
		par[i] = temp[i];
	}
	free(temp);
}